

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

void __thiscall BpTree<float>::BpTree(BpTree<float> *this,string *IndexFileName)

{
  pointer pcVar1;
  iterator __position;
  int iVar2;
  long lVar3;
  long lVar4;
  int n;
  int local_64;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string *local_58;
  string local_50;
  
  local_58 = &this->Index_FileName;
  local_60 = &(this->Index_FileName).field_2;
  (this->Index_FileName)._M_dataplus._M_p = (pointer)local_60;
  (this->Index_FileName)._M_string_length = 0;
  (this->Index_FileName).field_2._M_local_buf[0] = '\0';
  (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)local_58);
  pcVar1 = (IndexFileName->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + IndexFileName->_M_string_length);
  iVar2 = Buffer::Allocate(&blocks,&local_50,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  lVar3 = (long)iVar2;
  this->Data_Type = blocks.buffer[lVar3].data[0];
  this->N = *(int *)(blocks.buffer[lVar3].data + 1);
  (this->RootAddr).FileOff = *(int *)(blocks.buffer[lVar3].data + 5);
  this->Current_Off = *(int *)(blocks.buffer[lVar3].data + 9);
  iVar2 = *(int *)(blocks.buffer[lVar3].data + 0xd);
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      local_64 = *(int *)(lVar3 * 0x2028 + 0x15e3dd + lVar4 * 4);
      __position._M_current =
           (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->FileOff_bin,__position,&local_64);
      }
      else {
        *__position._M_current = local_64;
        (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar4 = lVar4 + 1;
    } while (iVar2 != (int)lVar4);
  }
  return;
}

Assistant:

BpTree<K>::BpTree(string IndexFileName) {
	int i, s, n;
	this->Index_FileName = IndexFileName;
	int BlockNum = blocks.Allocate(IndexFileName, 0);
	char* p = blocks.buffer[BlockNum].data;
	memcpy(&this->Data_Type, p, sizeof(char));
	p += sizeof(char);
	memcpy(&this->N, p, sizeof(int));
	p += sizeof(int);
	memcpy(reinterpret_cast<char*>(&this->RootAddr.FileOff), p, sizeof(int));
	p += sizeof(int);
	memcpy(reinterpret_cast<char*>(&this->Current_Off), p, sizeof(int));
	p += sizeof(int);
	memcpy(reinterpret_cast<char*>(&s), p, sizeof(int));
	p += sizeof(int);
	for (i = 0; i < s; i++) {
		memcpy(reinterpret_cast<char*>(&n), p, sizeof(int));
		p += sizeof(int);
		this->FileOff_bin.push_back(n);
	}
}